

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseEndTag1(xmlParserCtxtPtr ctxt,int line)

{
  int *piVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  endElementSAXFunc p_Var4;
  xmlChar *pxVar5;
  long lVar6;
  int *piVar7;
  xmlChar *pxVar8;
  
  pxVar3 = ctxt->input;
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  pxVar3 = ctxt->input;
  pxVar5 = pxVar3->cur;
  if ((*pxVar5 == '<') && (pxVar5[1] == '/')) {
    pxVar3->cur = pxVar5 + 2;
    pxVar3->col = pxVar3->col + 2;
    if (pxVar5[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar5 = xmlParseNameAndCompare(ctxt,ctxt->name);
    pxVar3 = ctxt->input;
    if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    pxVar3 = ctxt->input;
    pxVar8 = pxVar3->cur;
    if (*pxVar8 == '>') {
      pxVar3->col = pxVar3->col + 1;
      pxVar3->cur = pxVar8 + 1;
      if (pxVar8[1] == '\0') {
        xmlParserGrow(ctxt);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
    }
    if (pxVar5 != &DAT_00000001) {
      pxVar8 = (xmlChar *)"unparsable";
      if (pxVar5 != (xmlChar *)0x0) {
        pxVar8 = pxVar5;
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_TAG_NAME_MISMATCH,XML_ERR_FATAL,
                 ctxt->name,pxVar8,(xmlChar *)0x0,0,
                 "Opening and ending tag mismatch: %s line %d and %s\n",ctxt->name,0,pxVar8);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var4 = ctxt->sax->endElement, p_Var4 != (endElementSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var4)(ctxt->userData,ctxt->name);
    }
    iVar2 = ctxt->nameNr;
    lVar6 = (long)iVar2;
    if (0 < lVar6) {
      ctxt->nameNr = iVar2 + -1;
      if (iVar2 == 1) {
        pxVar5 = (xmlChar *)0x0;
      }
      else {
        pxVar5 = ctxt->nameTab[lVar6 + -2];
      }
      ctxt->name = pxVar5;
      ctxt->nameTab[lVar6 + -1] = (xmlChar *)0x0;
    }
    iVar2 = ctxt->spaceNr;
    if (0 < (long)iVar2) {
      ctxt->spaceNr = iVar2 + -1;
      piVar1 = ctxt->spaceTab + (long)iVar2 + -2;
      piVar7 = ctxt->spaceTab;
      if (iVar2 != 1) {
        piVar7 = piVar1;
      }
      ctxt->space = piVar7;
      piVar1[1] = -1;
    }
  }
  else {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_LTSLASH_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "xmlParseEndTag: \'</\' not found\n");
  }
  return;
}

Assistant:

static void
xmlParseEndTag1(xmlParserCtxtPtr ctxt, int line) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErrMsg(ctxt, XML_ERR_LTSLASH_REQUIRED,
		       "xmlParseEndTag: '</' not found\n");
	return;
    }
    SKIP(2);

    name = xmlParseNameAndCompare(ctxt,ctxt->name);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
	(!ctxt->disableSAX))
        ctxt->sax->endElement(ctxt->userData, ctxt->name);

    namePop(ctxt);
    spacePop(ctxt);
}